

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

spirv_cross * __thiscall
spirv_cross::
join<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
          (spirv_cross *this,char (*ts) [13],char *ts_1,uint *ts_2,char (*ts_3) [8],uint *ts_4,
          char (*ts_5) [2])

{
  undefined1 local_1128 [8];
  StringStream<4096UL,_4096UL> stream;
  uint *ts_local_4;
  char (*ts_local_3) [8];
  uint *ts_local_2;
  char *ts_local_1;
  char (*ts_local) [13];
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_4;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  inner::
  join_helper<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
            ((StringStream<4096UL,_4096UL> *)local_1128,ts,ts_1,ts_2,ts_3,
             (uint *)stream.saved_buffers.stack_storage.aligned_char._184_8_,ts_5);
  StringStream<4096ul,4096ul>::str_abi_cxx11_((StringStream<4096ul,4096ul> *)this);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1128);
  return this;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}